

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  ostream *poVar4;
  int i;
  ulong uVar5;
  char *pcVar6;
  long lVar7;
  _List_node_base *p_Var8;
  int *piVar9;
  allocator local_71;
  string path;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  in_file_list;
  
  in_file_list.
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node._M_size = 0;
  lVar7 = 1;
  bVar2 = false;
  in_file_list.
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&in_file_list;
  in_file_list.
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&in_file_list;
  do {
    if (argc <= lVar7) {
      if ((help_mode == false) &&
         (in_file_list.
          super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl._M_node._M_size != 0)) {
        if (bVar2) {
          if (force_initial_volume < 0) {
            force_initial_volume = 0x40;
          }
          for (p_Var8 = in_file_list.
                        super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl._M_node.super__List_node_base._M_next;
              p_Var8 != (_List_node_base *)&in_file_list;
              p_Var8 = (((_List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&p_Var8->_M_next)->_M_impl)._M_node.super__List_node_base._M_next) {
            std::__cxx11::string::string((string *)&path,(string *)(p_Var8 + 1));
            processDmcInputFile(&path);
            std::__cxx11::string::~string((string *)&path);
          }
        }
        else {
          poVar4 = std::operator<<((ostream *)&std::cout,"gain: ");
          *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) =
               *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) | 0x400;
          poVar4 = std::ostream::_M_insert<double>(wave_gain);
          std::endl<char,std::char_traits<char>>(poVar4);
          if (force_initial_volume < 0) {
            poVar4 = std::operator<<((ostream *)&std::cout,"initial volume: auto");
            std::endl<char,std::char_traits<char>>(poVar4);
          }
          poVar4 = std::operator<<((ostream *)&std::cout,"center bias level: ");
          poVar4 = (ostream *)std::ostream::operator<<(poVar4,center_bias_level);
          std::endl<char,std::char_traits<char>>(poVar4);
          poVar4 = std::operator<<((ostream *)&std::cout,"slope weight: ");
          *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) =
               *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) | 0x400;
          poVar4 = std::ostream::_M_insert<double>(shifter_weight);
          std::endl<char,std::char_traits<char>>(poVar4);
          if ((ulong)(uint)dither_mode < 4) {
            poVar4 = std::operator<<((ostream *)&std::cout,
                                     &DAT_00110290 +
                                     *(int *)(&DAT_00110290 + (ulong)(uint)dither_mode * 4));
            std::endl<char,std::char_traits<char>>(poVar4);
          }
          if ((ulong)(uint)noise_shape_mode < 4) {
            poVar4 = std::operator<<((ostream *)&std::cout,
                                     &DAT_001102a0 +
                                     *(int *)(&DAT_001102a0 + (ulong)(uint)noise_shape_mode * 4));
            std::endl<char,std::char_traits<char>>(poVar4);
          }
          pcVar6 = "linearity correction: off";
          if (use_linearity_correction != false) {
            pcVar6 = "linearity correction: on";
          }
          poVar4 = std::operator<<((ostream *)&std::cout,pcVar6);
          std::endl<char,std::char_traits<char>>(poVar4);
          for (p_Var8 = in_file_list.
                        super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl._M_node.super__List_node_base._M_next;
              p_Var8 != (_List_node_base *)&in_file_list;
              p_Var8 = (((_List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&p_Var8->_M_next)->_M_impl)._M_node.super__List_node_base._M_next) {
            std::__cxx11::string::string((string *)&path,(string *)(p_Var8 + 1));
            processInputFile(&path);
            std::__cxx11::string::~string((string *)&path);
          }
        }
        std::__cxx11::
        _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::_M_clear(&in_file_list.
                    super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  );
        return 0;
      }
      poVar4 = std::operator<<((ostream *)&std::cout,"Usage: dpcmc [options] <input> ..");
      std::endl<char,std::char_traits<char>>(poVar4);
      poVar4 = std::operator<<((ostream *)&std::cout,
                               "<input> supports uncompressed WAV, AIFF/AIFC, SND (AU), MAT-file (Matlab)"
                              );
      std::endl<char,std::char_traits<char>>(poVar4);
      poVar4 = std::operator<<((ostream *)&std::cout,"Options:");
      std::endl<char,std::char_traits<char>>(poVar4);
      poVar4 = std::operator<<((ostream *)&std::cout,"  -g[gain]   Input volume(default:gain=1.0)");
      std::endl<char,std::char_traits<char>>(poVar4);
      poVar4 = std::operator<<((ostream *)&std::cout,"  -i[0..127] Initial volume(default:auto)");
      std::endl<char,std::char_traits<char>>(poVar4);
      poVar4 = std::operator<<((ostream *)&std::cout,"  -c[0..127] Center bias level(default:64)");
      std::endl<char,std::char_traits<char>>(poVar4);
      poVar4 = std::operator<<((ostream *)&std::cout,"  -w[weight] Slope weight(default:weight=1.0)"
                              );
      std::endl<char,std::char_traits<char>>(poVar4);
      poVar4 = std::operator<<((ostream *)&std::cout,
                               "  -r[rate]   Output sampling rate(default:15) rate:");
      std::endl<char,std::char_traits<char>>(poVar4);
      piVar9 = sample_rate_cycles;
      for (uVar5 = 0; uVar5 != 0x10; uVar5 = uVar5 + 1) {
        if ((uVar5 & 3) == 0) {
          std::operator<<((ostream *)&std::cout,"                 ");
        }
        if (uVar5 < 10) {
          std::operator<<((ostream *)&std::cout," ");
        }
        poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,(uint)uVar5);
        poVar4 = std::operator<<(poVar4,":");
        *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) =
             *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) | 0x400;
        poVar4 = std::ostream::_M_insert<double>(1789772.5 / (double)*piVar9);
        std::operator<<(poVar4,"Hz ");
        if (((uint)uVar5 & 3) == 3) {
          std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
        }
        piVar9 = piVar9 + 1;
      }
      poVar4 = std::operator<<((ostream *)&std::cout,"  -n         No resampling");
      std::endl<char,std::char_traits<char>>(poVar4);
      poVar4 = std::operator<<((ostream *)&std::cout,"  -d[mode]   Dither mode:");
      std::endl<char,std::char_traits<char>>(poVar4);
      poVar4 = std::operator<<((ostream *)&std::cout,"                 0 : off");
      std::endl<char,std::char_traits<char>>(poVar4);
      poVar4 = std::operator<<((ostream *)&std::cout,"                 1 : Rectangle");
      std::endl<char,std::char_traits<char>>(poVar4);
      poVar4 = std::operator<<((ostream *)&std::cout,"                 2 : Triangle");
      std::endl<char,std::char_traits<char>>(poVar4);
      poVar4 = std::operator<<((ostream *)&std::cout,
                               "                 3 : Highpassed Triangle(default)");
      std::endl<char,std::char_traits<char>>(poVar4);
      poVar4 = std::operator<<((ostream *)&std::cout,"  -s[mode]   Noise shaping mode:");
      std::endl<char,std::char_traits<char>>(poVar4);
      poVar4 = std::operator<<((ostream *)&std::cout,"                 0 : off");
      std::endl<char,std::char_traits<char>>(poVar4);
      poVar4 = std::operator<<((ostream *)&std::cout,"                 1 : Lowpass");
      std::endl<char,std::char_traits<char>>(poVar4);
      poVar4 = std::operator<<((ostream *)&std::cout,"                 2 : Highpass");
      std::endl<char,std::char_traits<char>>(poVar4);
      poVar4 = std::operator<<((ostream *)&std::cout,"                 3 : equal-loudness(default)")
      ;
      std::endl<char,std::char_traits<char>>(poVar4);
      poVar4 = std::operator<<((ostream *)&std::cout,
                               "  -l         Disable correction of linearity(default:enable)");
      std::endl<char,std::char_traits<char>>(poVar4);
      poVar4 = std::operator<<((ostream *)&std::cout,
                               "  -e         Output envelope to wav file(default:off)");
      std::endl<char,std::char_traits<char>>(poVar4);
      poVar4 = std::operator<<((ostream *)&std::cout,
                               "  -p         Output preprocessed waveform to wav file(default:off)")
      ;
      std::endl<char,std::char_traits<char>>(poVar4);
      poVar4 = std::operator<<((ostream *)&std::cout,
                               "  -o         Output waveform after encode to wav file(default:off)")
      ;
      std::endl<char,std::char_traits<char>>(poVar4);
      poVar4 = std::operator<<((ostream *)&std::cout,"  -f         Convert dmc to wav file");
      std::endl<char,std::char_traits<char>>(poVar4);
      poVar4 = std::operator<<((ostream *)&std::cout,"  -h         Show this help");
      std::endl<char,std::char_traits<char>>(poVar4);
      exit(0);
    }
    pcVar6 = argv[lVar7];
    if (*pcVar6 != '-') {
      std::__cxx11::string::string((string *)&path,pcVar6,&local_71);
      std::__cxx11::
      list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&in_file_list,&path);
      goto LAB_0010826a;
    }
    switch(pcVar6[1]) {
    case 'c':
      std::__cxx11::string::string((string *)&path,pcVar6 + 2,&local_71);
      center_bias_level = std::__cxx11::stoi(&path,(size_t *)0x0,10);
      std::__cxx11::string::~string((string *)&path);
      iVar3 = center_bias_level;
      goto LAB_001083d4;
    case 'd':
      std::__cxx11::string::string((string *)&path,pcVar6 + 2,&local_71);
      dither_mode = std::__cxx11::stoi(&path,(size_t *)0x0,10);
      std::__cxx11::string::~string((string *)&path);
      uVar1 = dither_mode;
      goto joined_r0x001082e7;
    case 'e':
      output_envelope = true;
      break;
    case 'f':
      bVar2 = true;
      break;
    case 'g':
      std::__cxx11::string::string((string *)&path,pcVar6 + 2,&local_71);
      wave_gain = std::__cxx11::stod(&path,(size_t *)0x0);
      goto LAB_0010826a;
    case 'i':
      std::__cxx11::string::string((string *)&path,pcVar6 + 2,&local_71);
      force_initial_volume = std::__cxx11::stoi(&path,(size_t *)0x0,10);
      std::__cxx11::string::~string((string *)&path);
      iVar3 = force_initial_volume;
LAB_001083d4:
      if ((0x7f < iVar3) || (iVar3 < 0)) goto switchD_00108219_caseD_68;
      break;
    default:
      poVar4 = std::operator<<((ostream *)&std::cout,"Invalid option: ");
      poVar4 = std::operator<<(poVar4,argv[lVar7]);
      std::endl<char,std::char_traits<char>>(poVar4);
    case 'h':
switchD_00108219_caseD_68:
      help_mode = true;
      break;
    case 'l':
      use_linearity_correction = false;
      break;
    case 'n':
      no_resampling = true;
      break;
    case 'o':
      output_encoded_wav = true;
      break;
    case 'p':
      output_preprocessed = true;
      break;
    case 'r':
      std::__cxx11::string::string((string *)&path,pcVar6 + 2,&local_71);
      sample_rate_ind = std::__cxx11::stoi(&path,(size_t *)0x0,10);
      std::__cxx11::string::~string((string *)&path);
      if (0xf < (uint)sample_rate_ind) goto switchD_00108219_caseD_68;
      break;
    case 's':
      std::__cxx11::string::string((string *)&path,pcVar6 + 2,&local_71);
      noise_shape_mode = std::__cxx11::stoi(&path,(size_t *)0x0,10);
      std::__cxx11::string::~string((string *)&path);
      uVar1 = noise_shape_mode;
joined_r0x001082e7:
      if (3 < uVar1) goto switchD_00108219_caseD_68;
      break;
    case 'w':
      std::__cxx11::string::string((string *)&path,pcVar6 + 2,&local_71);
      shifter_weight = std::__cxx11::stod(&path,(size_t *)0x0);
LAB_0010826a:
      std::__cxx11::string::~string((string *)&path);
    }
    lVar7 = lVar7 + 1;
  } while( true );
}

Assistant:

int main(int argc, char * argv[])
{
	std::list<std::string> in_file_list;

	bool dmc2wav_mode = false;
	
	// コマンドラインオプションを処理する
	for (int i=1; i<argc; ++i) {
		if (argv[i][0] == '-') {
			switch (argv[i][1]) {
				case 'g':
					wave_gain = std::stod(&argv[i][2]);
					break;
					
				case 'i':
					force_initial_volume = std::stoi(&argv[i][2]);
					if (force_initial_volume > 127) help_mode = true;
					if (force_initial_volume < 0) help_mode = true;
					break;
					
				case 'c':
					center_bias_level = std::stoi(&argv[i][2]);
					if (center_bias_level > 127) help_mode = true;
					if (center_bias_level < 0) help_mode = true;
					break;

				case 'w':
					shifter_weight = std::stod(&argv[i][2]);
					break;
					
				case 'r':
					sample_rate_ind = std::stoi(&argv[i][2]);
					if (sample_rate_ind > 15 || sample_rate_ind < 0) {
						help_mode = true;
					}
					break;
					
				case 'n':
					no_resampling = true;
					break;
					
				case 'd':
					dither_mode = std::stoi(&argv[i][2]);
					if (dither_mode < 0 || dither_mode > 3) {
						help_mode = true;
					}
					break;
					
				case 's':
					noise_shape_mode = std::stoi(&argv[i][2]);
					if (noise_shape_mode < 0 || noise_shape_mode > 3) {
						help_mode = true;
					}
					break;

				case 'l':
					use_linearity_correction = false;
					break;
					
				case 'e':
					output_envelope = true;
					break;
					
				case 'p':
					output_preprocessed = true;
					break;

				case 'o':
					output_encoded_wav = true;
					break;

				case 'h':
					help_mode = true;
					break;
					
				case 'f':
					dmc2wav_mode = true;
					break;
					
				default:
					std::cout << "Invalid option: " << argv[i] << std::endl;
					help_mode = true;
					break;
			}
		}
		else {
			std::string path(argv[i]);
			in_file_list.push_back(path);
		}
	}
	
	if (help_mode || (in_file_list.size() == 0)) {
		std::cout << "Usage: dpcmc [options] <input> .." << std::endl;
		std::cout << "<input> supports uncompressed WAV, AIFF/AIFC, SND (AU), MAT-file (Matlab)" << std::endl;
		std::cout << "Options:" << std::endl;
		std::cout << "  -g[gain]   Input volume(default:gain=1.0)" << std::endl;
		std::cout << "  -i[0..127] Initial volume(default:auto)" << std::endl;
		std::cout << "  -c[0..127] Center bias level(default:64)" << std::endl;
		std::cout << "  -w[weight] Slope weight(default:weight=1.0)" << std::endl;
		std::cout << "  -r[rate]   Output sampling rate(default:15) rate:" << std::endl;
		for (int i=0; i<16; ++i) {
			if ((i % 4) == 0) {
				std::cout << "                 ";
			}
			if (i < 10) {
				std::cout << " ";
			}
			std::cout << i << ":" << std::showpoint << dpcmSampleRateValue(i) << "Hz ";
			if ((i % 4) == 3) {
				std::cout << std::endl;
			}
		}
		std::cout << "  -n         No resampling" << std::endl;
		std::cout << "  -d[mode]   Dither mode:" << std::endl;
		std::cout << "                 0 : off" << std::endl;
		std::cout << "                 1 : Rectangle" << std::endl;
		std::cout << "                 2 : Triangle" << std::endl;
		std::cout << "                 3 : Highpassed Triangle(default)" << std::endl;
		std::cout << "  -s[mode]   Noise shaping mode:" << std::endl;
		std::cout << "                 0 : off" << std::endl;
		std::cout << "                 1 : Lowpass" << std::endl;
		std::cout << "                 2 : Highpass" << std::endl;
		std::cout << "                 3 : equal-loudness(default)" << std::endl;
		std::cout << "  -l         Disable correction of linearity(default:enable)" << std::endl;
		std::cout << "  -e         Output envelope to wav file(default:off)" << std::endl;
		std::cout << "  -p         Output preprocessed waveform to wav file(default:off)" << std::endl;
		std::cout << "  -o         Output waveform after encode to wav file(default:off)" << std::endl;
		std::cout << "  -f         Convert dmc to wav file" << std::endl;
		std::cout << "  -h         Show this help" << std::endl;
		exit(0);
	}
	
	if (dmc2wav_mode) {
		if (force_initial_volume < 0) {
			force_initial_volume = 64;
		}
		
		std::for_each(in_file_list.cbegin(), in_file_list.cend(), [](std::string in_file_path) {
			processDmcInputFile(in_file_path);
		});
	}
	else {
		std::cout << "gain: " << std::showpoint << wave_gain << std::endl;
		if (force_initial_volume < 0) {
			std::cout << "initial volume: auto" << std::endl;
		}
		std::cout << "center bias level: " << center_bias_level << std::endl;
		std::cout << "slope weight: " << std::showpoint << shifter_weight << std::endl;
		switch (dither_mode) {
			case 0:
				std::cout << "dither: off" << std::endl;
				break;
			case 1:
				std::cout << "dither: Rectangle" << std::endl;
				break;
			case 2:
				std::cout << "dither: Triangle" << std::endl;
				break;
			case 3:
				std::cout << "dither: Highpass Triangle" << std::endl;
				break;
			default:
				break;
		}
		switch (noise_shape_mode) {
			case 0:
				std::cout << "noise shape: off" << std::endl;
				break;
			case 1:
				std::cout << "noise shape: Lowpass" << std::endl;
				break;
			case 2:
				std::cout << "noise shape: Highpass" << std::endl;
				break;
			case 3:
				std::cout << "noise shape: equal-loudness" << std::endl;
				break;
			default:
				break;
		}
		if (use_linearity_correction) {
			std::cout << "linearity correction: on" << std::endl;
		}
		else {
			std::cout << "linearity correction: off" << std::endl;
		}

		std::for_each(in_file_list.cbegin(), in_file_list.cend(), [](std::string in_file_path) {
			processInputFile(in_file_path);
		});
	}
	
	return 0;
}